

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::fft_destroy_plan(fft_plan p)

{
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  undefined4 uStack0000000000000010;
  undefined8 uStack0000000000000018;
  undefined8 uStack0000000000000020;
  undefined8 uStack0000000000000028;
  
  uStack0000000000000008 = 0;
  uStack0000000000000020 = 0;
  uStack0000000000000018 = 0;
  uStack0000000000000028 = 0;
  uStack000000000000000c = 0;
  uStack0000000000000010 = 0;
  if (p._8_8_ != 0) {
    operator_delete__((void *)p._8_8_);
  }
  if (p.c_in != (fft_complex *)0x0) {
    operator_delete__(p.c_in);
  }
  if (p.in != (double *)0x0) {
    operator_delete__(p.in);
  }
  return;
}

Assistant:

void fft_destroy_plan(fft_plan p) {
  p.n = 0;
  p.in = NULL;
  p.c_in = NULL;
  p.out = NULL;
  p.c_out = NULL;
  p.sign = 0;
  p.flags = 0;
  delete[] p.input;
  delete[] p.ip;
  delete[] p.w;
}